

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readParameters.hpp
# Opt level: O2

array<njoy::ENDFtk::section::Type<5>::Parameter,_2UL> * __thiscall
njoy::ENDFtk::section::Type<5>::WattSpectrum::
readParameters<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (array<njoy::ENDFtk::section::Type<5>::Parameter,_2UL> *__return_storage_ptr__,
          WattSpectrum *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT)

{
  Parameter a;
  anon_class_48_6_567bc7cc makeParameter;
  Parameter b;
  int local_170;
  undefined4 local_16c;
  TabulationRecord local_168;
  WattSpectrum *local_d8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_d0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c8;
  undefined4 *local_c0;
  int *local_b8;
  int *local_b0;
  TabulationRecord local_a8;
  
  local_16c = SUB84(lineNumber,0);
  local_c0 = &local_16c;
  local_b8 = &local_170;
  local_b0 = &MF;
  local_170 = MAT;
  local_d8 = this;
  local_d0 = begin;
  local_c8 = end;
  readParameters<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,long&,int,int,int)
  ::{lambda(auto:1&&)#1}::operator()
            ((Parameter *)&local_168,(_lambda_auto_1____1_ *)&local_d8,
             (char (*) [48])"Encountered error while reading the a parameter");
  readParameters<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,long&,int,int,int)
  ::{lambda(auto:1&&)#1}::operator()
            ((Parameter *)&local_a8,(_lambda_auto_1____1_ *)&local_d8,
             (char (*) [48])"Encountered error while reading the b parameter");
  TabulationRecord::TabulationRecord((TabulationRecord *)__return_storage_ptr__,&local_168);
  TabulationRecord::TabulationRecord
            (&__return_storage_ptr__->_M_elems[1].super_TabulationRecord,&local_a8);
  TabulationRecord::~TabulationRecord(&local_a8);
  TabulationRecord::~TabulationRecord(&local_168);
  return __return_storage_ptr__;
}

Assistant:

static std::array< Parameter, 2 >
readParameters( Iterator& begin,
                const Iterator& end,
                long& lineNumber,
                int MAT,
                int MF,
                int MT ) {

  auto makeParameter = [&] ( auto&& message ) {

    try {

      return Parameter( begin, end, lineNumber, MAT, MF, MT );
    }
    catch ( ... ) {

      Log::info( message );
      throw;
    }
  };

  auto a = makeParameter( "Encountered error while reading the a parameter" );
  auto b = makeParameter( "Encountered error while reading the b parameter" );
  return std::array< Parameter, 2 >{{ std::move( a) , std::move( b ) }};
}